

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_kernel_c.h
# Opt level: O2

void __thiscall
dlib::
map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::add(map_kernel_c<dlib::map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
      *this,domain *d,range *r)

{
  uint *puVar1;
  bool bVar2;
  ostream *poVar3;
  fatal_error *this_00;
  char *pcVar4;
  string local_1c0;
  ostringstream dlib_o_out;
  uint auStack_188 [88];
  
  bVar2 = map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::is_in_domain((map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                          *)this,d);
  if (((range *)d != r) && (!bVar2)) {
    binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
    ::add((binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>
           *)(this + 0x10),d,r);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x73);
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/bsp/../sockets/../threads/../map/map_kernel_c.h"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar3 = std::operator<<(poVar3,
                           "void dlib::map_kernel_c<dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>>::add(domain &, range &) [map_base = dlib::map_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::binary_search_tree_kernel_1<unsigned long, std::unique_ptr<dlib::impl1::bsp_con>, dlib::memory_manager_stateless_kernel_1<char>>>]"
                          );
  std::operator<<(poVar3,".\n\n");
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar3 = std::operator<<(poVar3,
                           "(!this->is_in_domain(d)) && (static_cast<void*>(&d) != static_cast<void*>(&r))"
                          );
  std::operator<<(poVar3,".\n");
  puVar1 = (uint *)((long)auStack_188 + *(long *)(_dlib_o_out + -0x18));
  *puVar1 = *puVar1 | 1;
  poVar3 = std::operator<<((ostream *)&dlib_o_out,"\tvoid map::add");
  poVar3 = std::operator<<(poVar3,"\n\tdomain element being added must not already be in the map");
  poVar3 = std::operator<<(poVar3,"\n\tand d and r must not be the same variable");
  poVar3 = std::operator<<(poVar3,"\n\tis_in_domain(d): ");
  bVar2 = map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          ::is_in_domain((map_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::binary_search_tree_kernel_1<unsigned_long,_std::unique_ptr<dlib::impl1::bsp_con,_std::default_delete<dlib::impl1::bsp_con>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<unsigned_long>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                          *)this,d);
  pcVar4 = "false";
  if (bVar2) {
    pcVar4 = "true";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,"\n\tthis: ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  poVar3 = std::operator<<(poVar3,"\n\t&d:   ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  poVar3 = std::operator<<(poVar3,"\n\t&r:   ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  std::operator<<(poVar3,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1c0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void map_kernel_c<map_base>::
    add (
        domain& d,
        range& r
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT( (!this->is_in_domain(d)) &&
                (static_cast<void*>(&d) != static_cast<void*>(&r)),
            "\tvoid map::add"
            << "\n\tdomain element being added must not already be in the map"
            << "\n\tand d and r must not be the same variable"
            << "\n\tis_in_domain(d): " << (this->is_in_domain(d) ? "true" : "false")
            << "\n\tthis: " << this
            << "\n\t&d:   " << static_cast<void*>(&d)
            << "\n\t&r:   " << static_cast<void*>(&r)
            );

        // call the real function
        map_base::add(d,r);
    }